

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O1

void __thiscall cmCTestBZR::cmCTestBZR(cmCTestBZR *this,cmCTest *ct,ostream *log)

{
  string local_40;
  
  cmCTestGlobalVC::cmCTestGlobalVC(&this->super_cmCTestGlobalVC,ct,log);
  (this->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC =
       (_func_int **)&PTR__cmCTestBZR_00960678;
  (this->URL)._M_dataplus._M_p = (pointer)&(this->URL).field_2;
  (this->URL)._M_string_length = 0;
  (this->URL).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev);
  std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev.Date);
  std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev.Author);
  std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev.EMail);
  std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev.Committer);
  std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev.CommitterEMail);
  std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev.CommitDate);
  std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev.Log);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"BZR_PROGRESS_BAR=none","");
  cmsys::SystemTools::PutEnv(&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

cmCTestBZR::cmCTestBZR(cmCTest* ct, std::ostream& log)
  : cmCTestGlobalVC(ct, log)
{
  this->PriorRev = this->Unknown;
  // Even though it is specified in the documentation, with bzr 1.13
  // BZR_PROGRESS_BAR has no effect. In the future this bug might be fixed.
  // Since it doesn't hurt, we specify this environment variable.
  cmSystemTools::PutEnv("BZR_PROGRESS_BAR=none");
}